

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O2

void add_child(_node_t *to,_node_t *child)

{
  _node_s **pp_Var1;
  uint uVar2;
  
  uVar2 = to->num_children + 1;
  to->num_children = uVar2;
  pp_Var1 = (_node_s **)mrealloc(to->children,(ulong)uVar2 << 3);
  to->children = pp_Var1;
  pp_Var1[to->num_children - 1] = child;
  child->parent = to;
  return;
}

Assistant:

void add_child(_node_t* to, _node_t* child)
{
    _node_t** new;
    to->num_children++;
    new =
        (_node_t**)mrealloc(to->children, sizeof(_node_t*) * to->num_children);

    to->children = new;
    to->children[to->num_children - 1] = child;
    child->parent = to;
}